

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O2

void helics::valueExtract(data_view *data,DataType baseType,NamedPoint *val)

{
  long lVar1;
  vector<double,_std::allocator<double>_> *val_00;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *val_01;
  undefined4 in_register_00000034;
  helics *this;
  double extraout_XMM0_Qa;
  double dVar2;
  double in_XMM1_Qa;
  complex<double> val_02;
  complex<double> cVar3;
  vector<double,_std::allocator<double>_> vec;
  double local_60;
  _Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> local_58;
  undefined1 in_stack_ffffffffffffffc8 [16];
  
  this = (helics *)CONCAT44(in_register_00000034,baseType);
  if ((uint)(baseType + HELICS_UNKNOWN) < 8) {
    lVar1 = (long)&switchD_001c51b2::switchdataD_003381ac +
            (long)(int)(&switchD_001c51b2::switchdataD_003381ac)[(uint)(baseType + HELICS_UNKNOWN)];
    switch(baseType) {
    case HELICS_DOUBLE:
      local_60 = ValueConverter<double>::interpret(data);
      break;
    case HELICS_INT:
      lVar1 = ValueConverter<long>::interpret(data);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                (&val->name,"value");
      local_60 = (double)lVar1;
      goto LAB_001c5417;
    case HELICS_COMPLEX:
      cVar3 = ValueConverter<std::complex<double>_>::interpret(data);
      val_02._M_value._0_8_ = cVar3._M_value._8_8_;
      if ((in_XMM1_Qa != 0.0) || (local_60 = extraout_XMM0_Qa, NAN(in_XMM1_Qa))) {
        val_02._M_value._8_8_ = lVar1;
        helicsComplexString_abi_cxx11_((string *)&stack0xffffffffffffffc0,this,val_02);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=(&val->name,(string *)&stack0xffffffffffffffc0);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
        local_60 = nan("0");
        goto LAB_001c5417;
      }
      break;
    case HELICS_VECTOR:
      ValueConverter<std::vector<double,_std::allocator<double>_>_>::interpret
                ((vector<double,_std::allocator<double>_> *)&local_58,data);
      if ((long)local_58._M_impl.super__Vector_impl_data._M_finish -
          (long)local_58._M_impl.super__Vector_impl_data._M_start == 8) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                  (&val->name,"value");
        dVar2 = *(double *)(local_58._M_impl.super__Vector_impl_data._M_start)->_M_value;
      }
      else {
        helicsVectorString_abi_cxx11_((string *)&stack0xffffffffffffffc0,(helics *)&local_58,val_00)
        ;
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=(&val->name,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &stack0xffffffffffffffc0);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
        dVar2 = nan("0");
      }
      val->value = dVar2;
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&local_58);
      return;
    case HELICS_COMPLEX_VECTOR:
      ValueConverter<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
      interpret((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&local_58,
                data);
      if ((long)local_58._M_impl.super__Vector_impl_data._M_finish -
          (long)local_58._M_impl.super__Vector_impl_data._M_start == 0x10) {
        cVar3._M_value._8_8_ = 0x10;
        cVar3._M_value._0_8_ = val_01;
        helicsComplexString_abi_cxx11_((string *)&stack0xffffffffffffffc0,(helics *)data,cVar3);
      }
      else {
        helicsComplexVectorString_abi_cxx11_
                  ((string *)&stack0xffffffffffffffc0,(helics *)&local_58,val_01);
      }
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(&val->name,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &stack0xffffffffffffffc0);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
      dVar2 = nan("0");
      val->value = dVar2;
      std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
                (&local_58);
      return;
    case HELICS_NAMED_POINT:
      ValueConverter<helics::NamedPoint>::interpret((NamedPoint *)&stack0xffffffffffffffc0,data);
      goto LAB_001c534b;
    case HELICS_BOOL:
      goto switchD_001c51b2_caseD_7;
    case HELICS_TIME:
      lVar1 = ValueConverter<long>::interpret(data);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                (&val->name,"time");
      val->value = (double)(lVar1 % 1000000000) * 1e-09 + (double)(lVar1 / 1000000000);
      return;
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (&val->name,"value");
LAB_001c5417:
    val->value = local_60;
    return;
  }
  if (baseType == HELICS_JSON) {
    readJsonValue_abi_cxx11_((defV *)&stack0xffffffffffffffc0,(helics *)data,(data_view *)val);
    valueExtract((defV *)&stack0xffffffffffffffc0,val);
    std::__detail::__variant::
    _Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
    ::~_Variant_storage((_Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                         *)&stack0xffffffffffffffc0);
    return;
  }
switchD_001c51b2_caseD_7:
  ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::interpret(data);
  helicsGetNamedPoint((string_view)in_stack_ffffffffffffffc8);
LAB_001c534b:
  NamedPoint::operator=(val,(NamedPoint *)&stack0xffffffffffffffc0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  return;
}

Assistant:

void valueExtract(const data_view& data, DataType baseType, NamedPoint& val)
{
    switch (baseType) {
        case DataType::HELICS_DOUBLE: {
            auto value = ValueConverter<double>::interpret(data);
            val.name = "value";
            val.value = value;
            break;
        }
        case DataType::HELICS_INT: {
            auto value = ValueConverter<int64_t>::interpret(data);
            val.name = "value";
            val.value = static_cast<double>(value);
            break;
        }
        case DataType::HELICS_TIME: {
            const Time time(ValueConverter<int64_t>::interpret(data), time_units::ns);
            val.name = "time";
            val.value = static_cast<double>(time);
        } break;
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
        default: {
            val = helicsGetNamedPoint(ValueConverter<std::string_view>::interpret(data));
            break;
        }
        case DataType::HELICS_VECTOR: {
            auto vec = ValueConverter<std::vector<double>>::interpret(data);
            if (vec.size() == 1) {
                val.name = "value";

                val.value = vec[0];
            } else {
                val.name = helicsVectorString(vec);
                val.value = std::nan("0");
            }
            break;
        }
        case DataType::HELICS_COMPLEX: {
            auto cval = ValueConverter<std::complex<double>>::interpret(data);
            if (cval.imag() == 0) {
                val.name = "value";
                val.value = cval.real();
            } else {
                val.name = helicsComplexString(cval);
                val.value = std::nan("0");
            }

            break;
        }
        case DataType::HELICS_COMPLEX_VECTOR: {
            auto cvec = ValueConverter<std::vector<std::complex<double>>>::interpret(data);
            if (cvec.size() == 1) {
                val.name = helicsComplexString(cvec[0]);
                val.value = std::nan("0");
            } else {
                val.name = helicsComplexVectorString(cvec);
                val.value = std::nan("0");
            }
            break;
        }
        case DataType::HELICS_NAMED_POINT:
            val = ValueConverter<NamedPoint>::interpret(data);
            break;
        case DataType::HELICS_JSON:
            valueExtract(readJsonValue(data), val);
            break;
    }
}